

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64-decode.c
# Opt level: O3

int lws_b64_decode_stateful
              (lws_b64state *s,char *in,size_t *in_len,uint8_t *out,size_t *out_size,int final)

{
  int iVar1;
  size_t sVar2;
  char cVar3;
  uchar uVar4;
  ulong uVar5;
  byte bVar6;
  byte *pbVar7;
  uint uVar8;
  byte *pbVar9;
  int iVar10;
  byte *pbVar11;
  bool bVar12;
  int local_50;
  int local_40;
  
  pbVar9 = (byte *)(in + *in_len);
  sVar2 = *out_size;
  pbVar7 = out;
  pbVar11 = (byte *)in;
  do {
    do {
      if (((pbVar9 <= pbVar11) || (*pbVar11 == 0)) || (out + sVar2 <= pbVar7 + 4)) {
        *pbVar7 = 0;
        local_50 = (int)in;
        *in_len = (ulong)(uint)((int)pbVar11 - local_50);
        local_40 = (int)out;
        *out_size = (ulong)(uint)((int)pbVar7 - local_40);
        return 0;
      }
      iVar10 = s->i;
      if (iVar10 < 4) {
        do {
          if (*pbVar11 == 0) goto LAB_001341ca;
          s->c = 0;
          if (pbVar11 < pbVar9) {
            bVar6 = *pbVar11;
            if (bVar6 == 0) {
              bVar12 = true;
              cVar3 = '\0';
            }
            else {
              do {
                pbVar11 = pbVar11 + 1;
                uVar8 = (uint)bVar6;
                if (bVar6 == 0x2d) {
                  uVar8 = 0x2b;
                }
                if ((char)uVar8 == '_') {
                  uVar8 = 0x2f;
                }
                s->c = uVar8;
                if ((byte)((char)uVar8 + 0x85U) < 0xb0) {
LAB_0013416d:
                  cVar3 = '\0';
                }
                else {
                  if (("|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                       [uVar8 - 0x2b] == '$') || (uVar8 - 0x2b == 0x50)) goto LAB_0013416d;
                  cVar3 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                          [uVar8 - 0x2b] + -0x3d;
                }
              } while (((pbVar11 < pbVar9) && (cVar3 == '\0')) && (bVar6 = *pbVar11, bVar6 != 0));
              bVar12 = (char)uVar8 == '\0';
            }
            if (bVar12) goto LAB_00134198;
            s->len = s->len + 1;
            if (cVar3 != '\0') {
              uVar4 = cVar3 + 0xff;
              goto LAB_0013419a;
            }
          }
          else {
LAB_00134198:
            uVar4 = '\0';
LAB_0013419a:
            s->quad[iVar10] = uVar4;
          }
          iVar1 = s->i;
          iVar10 = iVar1 + 1;
          s->i = iVar10;
          bVar12 = pbVar11 < pbVar9;
        } while ((bVar12) && (iVar1 < 3));
      }
      else {
LAB_001341ca:
        bVar12 = true;
      }
    } while ((final == 0) && (iVar10 != 4));
    s->i = 0;
    if (bVar12) {
      uVar5 = s->len;
      if (*pbVar11 == 0) goto LAB_001341f5;
    }
    else {
      uVar5 = s->len;
LAB_001341f5:
      if (s->c == 0x3d) {
        uVar5 = uVar5 - 1;
        s->len = uVar5;
      }
    }
    if (1 < uVar5) {
      *pbVar7 = s->quad[1] >> 4 | s->quad[0] << 2;
      uVar5 = s->len;
      if (uVar5 < 3) {
        pbVar7 = pbVar7 + 1;
      }
      else {
        pbVar7[1] = s->quad[2] >> 2 | s->quad[1] << 4;
        uVar5 = s->len;
        if (uVar5 < 4) {
          pbVar7 = pbVar7 + 2;
        }
        else {
          pbVar7[2] = s->quad[2] << 6 | s->quad[3];
          pbVar7 = pbVar7 + 3;
          uVar5 = s->len;
        }
      }
    }
    s->done = (uVar5 + s->done) - 1;
    s->len = 0;
  } while( true );
}

Assistant:

int
lws_b64_decode_stateful(struct lws_b64state *s, const char *in, size_t *in_len,
			uint8_t *out, size_t *out_size, int final)
{
	const char *orig_in = in, *end_in = in + *in_len;
	uint8_t *orig_out = out, *end_out = out + *out_size;

	while (in < end_in && *in && out + 4 < end_out) {

		for (; s->i < 4 && in < end_in && *in; s->i++) {
			uint8_t v;

			v = 0;
			s->c = 0;
			while (in < end_in && *in && !v) {
				s->c = v = (unsigned char)*in++;
				/* support the url base64 variant too */
				if (v == '-')
					s->c = v = '+';
				if (v == '_')
					s->c = v = '/';
				v = (uint8_t)((v < 43 || v > 122) ? 0 : decode[v - 43]);
				if (v)
					v = (uint8_t)((v == '$') ? 0 : v - 61);
			}
			if (s->c) {
				s->len++;
				if (v)
					s->quad[s->i] = (uint8_t)(v - 1);
			} else
				s->quad[s->i] = 0;
		}

		if (s->i != 4 && !final)
			continue;

		s->i = 0;

		/*
		 * "The '==' sequence indicates that the last group contained
		 * only one byte, and '=' indicates that it contained two
		 * bytes." (wikipedia)
		 */

		if ((in >= end_in || !*in) && s->c == '=')
			s->len--;

		if (s->len >= 2)
			*out++ = (uint8_t)(s->quad[0] << 2 | s->quad[1] >> 4);
		if (s->len >= 3)
			*out++ = (uint8_t)(s->quad[1] << 4 | s->quad[2] >> 2);
		if (s->len >= 4)
			*out++ = (uint8_t)(((s->quad[2] << 6) & 0xc0) | s->quad[3]);

		s->done += s->len - 1;
		s->len = 0;
	}

	*out = '\0';
	*in_len = (unsigned int)(in - orig_in);
	*out_size = (unsigned int)(out - orig_out);

	return 0;
}